

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O3

Token __thiscall slang::syntax::SyntaxNode::childToken(SyntaxNode *this,size_t index)

{
  Token *this_00;
  ConstGetChildVisitor *in_RCX;
  unsigned_long *in_R8;
  ConstTokenOrSyntax child;
  variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_30;
  Token local_18;
  
  detail::
  visitSyntaxNode<slang::syntax::SyntaxNode_const,(anonymous_namespace)::ConstGetChildVisitor,unsigned_long&>
            ((ConstTokenOrSyntax *)&local_30,(detail *)this,(SyntaxNode *)index,in_RCX,in_R8);
  if (local_30.super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      _M_index == '\0') {
    this_00 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(&local_30);
  }
  else {
    this_00 = &local_18;
    parsing::Token::Token(this_00);
  }
  return *this_00;
}

Assistant:

parsing::Token SyntaxNode::childToken(size_t index) const {
    auto child = getChild(index);
    if (!child.isToken())
        return Token();
    return child.token();
}